

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

void __thiscall soul::heart::Parser::parseFunctionDecls(Parser *this,ScannedTopLevelItem *item)

{
  ulong uVar1;
  Module *pMVar2;
  size_t sVar3;
  size_type sVar4;
  reference pvVar5;
  Function *f;
  UTF8Reader local_28;
  ulong local_20;
  size_t i;
  ScannedTopLevelItem *item_local;
  Parser *this_local;
  
  i = (size_t)item;
  item_local = (ScannedTopLevelItem *)this;
  prepareToRescan(this,item);
  pMVar2 = pool_ptr<soul::Module>::operator->(&this->module);
  sVar3 = Module::Functions::size(&pMVar2->functions);
  sVar4 = std::vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>::size
                    ((vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_> *)(i + 0x10));
  checkAssertion(sVar3 == sVar4,"module->functions.size() == item.functionParamCode.size()",
                 "parseFunctionDecls",0xe7);
  pMVar2 = pool_ptr<soul::Module>::operator->(&this->module);
  sVar3 = Module::Functions::size(&pMVar2->functions);
  sVar4 = std::vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>::size
                    ((vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_> *)(i + 0x28));
  checkAssertion(sVar3 == sVar4,"module->functions.size() == item.functionBodyCode.size()",
                 "parseFunctionDecls",0xe8);
  local_20 = 0;
  while( true ) {
    uVar1 = local_20;
    sVar4 = std::vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>::size
                      ((vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_> *)(i + 0x10));
    if (sVar4 <= uVar1) break;
    pvVar5 = std::vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_>::operator[]
                       ((vector<soul::UTF8Reader,_std::allocator<soul::UTF8Reader>_> *)(i + 0x10),
                        local_20);
    UTF8Reader::UTF8Reader(&local_28,pvVar5);
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    resetPosition(&this->
                   super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                  ,&local_28);
    pMVar2 = pool_ptr<soul::Module>::operator->(&this->module);
    f = Module::Functions::at(&pMVar2->functions,local_20);
    parseFunctionParams(this,f);
    local_20 = local_20 + 1;
  }
  pool_ptr<soul::Module>::reset(&this->module);
  return;
}

Assistant:

void parseFunctionDecls (ScannedTopLevelItem& item)
    {
        prepareToRescan (item);
        SOUL_ASSERT (module->functions.size() == item.functionParamCode.size());
        SOUL_ASSERT (module->functions.size() == item.functionBodyCode.size());

        for (size_t i = 0; i < item.functionParamCode.size(); ++i)
        {
            resetPosition (item.functionParamCode[i]);
            parseFunctionParams (module->functions.at (i));
        }

        module.reset();
    }